

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void google::protobuf::internal::PrintAllCounters(void)

{
  Nonnull<std::FILE_*> p_Var1;
  type *ptVar2;
  Map *this;
  bool bVar3;
  reference ppVar4;
  type *this_00;
  reference ppRVar5;
  size_t sVar6;
  long *args;
  basic_string_view<char,_std::char_traits<char>_> *args_00;
  size_type sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)262148,_(absl::lts_20250127::FormatConversionCharSet)655355>
  local_158;
  FormatSpecTemplate<> local_148;
  double local_138;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)654848> local_130;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)655355>
  local_120;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
  local_110;
  RealDebugCounter *local_100;
  RealDebugCounter *counter_1;
  iterator __end4_1;
  iterator __begin4_1;
  type *__range4_1;
  size_t value;
  type *counter_vector;
  type *subname;
  _Self local_c0;
  iterator __end3_1;
  iterator __begin3_1;
  type *__range3_1;
  RealDebugCounter *counter;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
  *__range4;
  pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
  *entry;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  size_t total;
  type *local_50;
  type *category_map;
  type *category_name;
  _Self local_38;
  iterator __end2;
  iterator __begin2;
  Map *__range2;
  Map *local_10;
  Map *counters;
  
  local_10 = CounterMap();
  bVar3 = std::
          map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
          ::empty(local_10);
  p_Var1 = _stderr;
  if (!bVar3) {
    absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
              ((FormatSpecTemplate<> *)&__range2,"Protobuf debug counters:\n");
    absl::lts_20250127::FPrintF<>(p_Var1,(FormatSpec<> *)&__range2);
    this = local_10;
    __end2 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
             ::begin(local_10);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
         ::end(this);
    while (bVar3 = std::operator!=(&__end2,&local_38), bVar3) {
      category_name =
           &std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>
            ::operator*(&__end2)->first;
      category_map = (type *)std::
                             get<0ul,std::basic_string_view<char,std::char_traits<char>>const,std::map<std::variant<long,std::basic_string_view<char,std::char_traits<char>>>,std::vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>,std::less<std::variant<long,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::variant<long,std::basic_string_view<char,std::char_traits<char>>>const,std::vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>>>>>
                                       ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>
                                         *)category_name);
      local_50 = std::
                 get<1ul,std::basic_string_view<char,std::char_traits<char>>const,std::map<std::variant<long,std::basic_string_view<char,std::char_traits<char>>>,std::vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>,std::less<std::variant<long,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::variant<long,std::basic_string_view<char,std::char_traits<char>>>const,std::vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>>>>>
                           ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>
                             *)category_name);
      p_Var1 = _stderr;
      absl::lts_20250127::str_format_internal::
      FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292>::FormatSpecTemplate
                ((FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292> *)&total,
                 "  %-12s:\n");
      absl::lts_20250127::FPrintF<std::basic_string_view<char,_std::char_traits<char>_>_>
                (p_Var1,(FormatSpec<std::basic_string_view<char>_> *)&total,
                 (basic_string_view<char,_std::char_traits<char>_> *)category_map);
      ptVar2 = local_50;
      __range3 = (type *)0x0;
      __end3 = std::
               map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
               ::begin(local_50);
      entry = (pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
               *)std::
                 map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
                 ::end(ptVar2);
      while (bVar3 = std::operator!=(&__end3,(_Self *)&entry), ptVar2 = local_50, bVar3) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>
                 ::operator*(&__end3);
        __end4 = std::
                 vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
                 ::begin(&ppVar4->second);
        counter = (RealDebugCounter *)
                  std::
                  vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
                  ::end(&ppVar4->second);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_google::protobuf::internal::RealDebugCounter_**,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
                                           *)&counter), bVar3) {
          ppRVar5 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::internal::RealDebugCounter_**,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
                    ::operator*(&__end4);
          sVar6 = RealDebugCounter::value(*ppRVar5);
          __range3 = (type *)(&(__range3->_M_t)._M_impl.field_0x0 + sVar6);
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::internal::RealDebugCounter_**,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
          ::operator++(&__end4);
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>
        ::operator++(&__end3);
      }
      __end3_1 = std::
                 map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
                 ::begin(local_50);
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
           ::end(ptVar2);
      while (bVar3 = std::operator!=(&__end3_1,&local_c0), bVar3) {
        subname = &std::
                   _Rb_tree_iterator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>
                   ::operator*(&__end3_1)->first;
        counter_vector =
             (type *)std::
                     get<0ul,std::variant<long,std::basic_string_view<char,std::char_traits<char>>>const,std::vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>>
                               ((pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
                                 *)subname);
        this_00 = std::
                  get<1ul,std::variant<long,std::basic_string_view<char,std::char_traits<char>>>const,std::vector<google::protobuf::internal::RealDebugCounter_const*,std::allocator<google::protobuf::internal::RealDebugCounter_const*>>>
                            ((pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
                              *)subname);
        __range4_1 = (type *)0x0;
        value = (size_t)this_00;
        __end4_1 = std::
                   vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
                   ::begin(this_00);
        counter_1 = (RealDebugCounter *)
                    std::
                    vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
                    ::end(this_00);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<const_google::protobuf::internal::RealDebugCounter_**,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
                                   *)&counter_1), bVar3) {
          ppRVar5 = __gnu_cxx::
                    __normal_iterator<const_google::protobuf::internal::RealDebugCounter_**,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
                    ::operator*(&__end4_1);
          local_100 = *ppRVar5;
          sVar6 = RealDebugCounter::value(local_100);
          __range4_1 = (type *)((long)&(__range4_1->
                                       super__Vector_base<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start + sVar6);
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::internal::RealDebugCounter_**,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>
          ::operator++(&__end4_1);
        }
        bVar3 = std::
                holds_alternative<long,long,std::basic_string_view<char,std::char_traits<char>>>
                          ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           counter_vector);
        p_Var1 = _stderr;
        if (bVar3) {
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)655355>
          ::FormatSpecTemplate(&local_110,"    %9d : %10zu");
          args = std::get<long,long,std::basic_string_view<char,std::char_traits<char>>>
                           ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_> *
                            )counter_vector);
          absl::lts_20250127::FPrintF<long,_unsigned_long>
                    (p_Var1,&local_110,args,(unsigned_long *)&__range4_1);
        }
        else {
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)524292,_(absl::lts_20250127::FormatConversionCharSet)655355>
          ::FormatSpecTemplate(&local_120,"    %-10s: %10zu");
          args_00 = std::
                    get<std::basic_string_view<char,std::char_traits<char>>,long,std::basic_string_view<char,std::char_traits<char>>>
                              ((variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>
                                *)counter_vector);
          absl::lts_20250127::
          FPrintF<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                    (p_Var1,&local_120,args_00,(unsigned_long *)&__range4_1);
        }
        if ((__range3 != (type *)0x0) &&
           (sVar7 = std::
                    map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
                    ::size(local_50), p_Var1 = _stderr, 1 < sVar7)) {
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)654848>::
          FormatSpecTemplate(&local_130," (%5.2f%%)");
          auVar8._8_4_ = (int)((ulong)__range4_1 >> 0x20);
          auVar8._0_8_ = __range4_1;
          auVar8._12_4_ = 0x45300000;
          auVar9._8_4_ = (int)((ulong)__range3 >> 0x20);
          auVar9._0_8_ = __range3;
          auVar9._12_4_ = 0x45300000;
          local_138 = (((auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)__range4_1) - 4503599627370496.0)) * 100.0)
                      / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)__range3) - 4503599627370496.0));
          absl::lts_20250127::FPrintF<double>(p_Var1,&local_130,&local_138);
        }
        p_Var1 = _stderr;
        absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
                  (&local_148,"\n");
        absl::lts_20250127::FPrintF<>(p_Var1,&local_148);
        std::
        _Rb_tree_iterator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>
        ::operator++(&__end3_1);
      }
      if ((__range3 != (type *)0x0) &&
         (sVar7 = std::
                  map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>
                  ::size(local_50), p_Var1 = _stderr, 1 < sVar7)) {
        absl::lts_20250127::str_format_internal::
        FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)262148,_(absl::lts_20250127::FormatConversionCharSet)655355>
        ::FormatSpecTemplate(&local_158,"    %-10s: %10zu\n");
        absl::lts_20250127::FPrintF<char[6],_unsigned_long>
                  (p_Var1,&local_158,(char (*) [6])"Total",(unsigned_long *)&__range3);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

static void PrintAllCounters() {
  auto& counters = CounterMap();
  if (counters.empty()) return;
  absl::FPrintF(stderr, "Protobuf debug counters:\n");
  for (auto& [category_name, category_map] : counters) {
    // Example output:
    //
    //   Category  :
    //     Value 1 : 1234 (12.34%)
    //     Value 2 : 2345 (23.45%)
    //     Total   : 3579
    absl::FPrintF(stderr, "  %-12s:\n", category_name);
    size_t total = 0;
    for (auto& entry : category_map) {
      for (auto* counter : entry.second) {
        total += counter->value();
      }
    }
    for (auto& [subname, counter_vector] : category_map) {
      size_t value = 0;
      for (auto* counter : counter_vector) {
        value += counter->value();
      }
      if (std::holds_alternative<int64_t>(subname)) {
        // For integers, right align
        absl::FPrintF(stderr, "    %9d : %10zu", std::get<int64_t>(subname),
                      value);
      } else {
        // For strings, left align
        absl::FPrintF(stderr, "    %-10s: %10zu",
                      std::get<absl::string_view>(subname), value);
      }
      if (total != 0 && category_map.size() > 1) {
        absl::FPrintF(
            stderr, " (%5.2f%%)",
            100. * static_cast<double>(value) / static_cast<double>(total));
      }
      absl::FPrintF(stderr, "\n");
    }
    if (total != 0 && category_map.size() > 1) {
      absl::FPrintF(stderr, "    %-10s: %10zu\n", "Total", total);
    }
  }
}